

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNDely.cpp
# Opt level: O1

void __thiscall NaPNDelay::set_delay(NaPNDelay *this,uint nDim,uint *piMap)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  undefined4 *puVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  
  NaPetriNode::check_tunable(&this->super_NaPetriNode);
  this->nOutDim = nDim;
  if (this->piOutMap != (uint *)0x0) {
    operator_delete(this->piOutMap,4);
  }
  iVar1 = this->nOutDim;
  if ((long)iVar1 == 0) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 3;
  }
  else {
    if (piMap != (uint *)0x0) {
      uVar6 = 0xffffffffffffffff;
      if (-1 < iVar1) {
        uVar6 = (long)iVar1 << 2;
      }
      puVar3 = (uint *)operator_new__(uVar6);
      this->piOutMap = puVar3;
      this->nMaxLag = 0;
      this->nMinLag = 0;
      if (this->nOutDim != 0) {
        uVar5 = this->nMaxLag;
        uVar7 = this->nMinLag;
        iVar1 = this->nOutDim;
        uVar6 = 0;
        do {
          uVar2 = piMap[uVar6];
          puVar3[uVar6] = uVar2;
          if (uVar5 < uVar2) {
            this->nMaxLag = uVar2;
            uVar5 = uVar2;
          }
          uVar8 = uVar7;
          if (uVar6 == 0) {
            uVar8 = uVar2;
          }
          uVar7 = uVar8;
          if (uVar2 < uVar8) {
            uVar7 = uVar2;
          }
          if ((uVar6 == 0) || (uVar2 < uVar8)) {
            this->nMinLag = uVar7;
          }
          uVar6 = uVar6 + 1;
        } while (iVar1 + (uint)(iVar1 == 0) != uVar6);
      }
      return;
    }
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0;
  }
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

void
NaPNDelay::set_delay (unsigned nDim, unsigned* piMap)
{
  check_tunable();

  nOutDim = nDim;
  delete piOutMap;

  if(0 == nOutDim)
    throw(na_bad_value);
  else if(NULL == piMap)
    throw(na_null_pointer);

  piOutMap = new unsigned[nOutDim];
  nMaxLag = 0;
  nMinLag = 0;
  unsigned	i;
  for(i = 0; i < nOutDim; ++i)
    {
      piOutMap[i] = piMap[i];
      if(piOutMap[i] > nMaxLag)
	nMaxLag = piOutMap[i];

      if(0 == i)
	nMinLag = piOutMap[i];
      if(piOutMap[i] < nMinLag)
	nMinLag = piOutMap[i];
    }
}